

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_poll.c
# Opt level: O0

int mbedtls_platform_entropy_poll(void *data,uchar *output,size_t len,size_t *olen)

{
  int iVar1;
  int *piVar2;
  FILE *__stream;
  size_t sVar3;
  int ret;
  size_t read_len;
  FILE *file;
  size_t *olen_local;
  size_t len_local;
  uchar *output_local;
  void *data_local;
  
  iVar1 = getrandom_wrapper(output,len,0);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0x26) {
      *olen = 0;
      __stream = fopen("/dev/urandom","rb");
      if (__stream == (FILE *)0x0) {
        data_local._4_4_ = -0x3c;
      }
      else {
        sVar3 = fread(output,1,len,__stream);
        if (sVar3 == len) {
          fclose(__stream);
          *olen = len;
          data_local._4_4_ = 0;
        }
        else {
          fclose(__stream);
          data_local._4_4_ = -0x3c;
        }
      }
    }
    else {
      data_local._4_4_ = -0x3c;
    }
  }
  else {
    *olen = (long)iVar1;
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

int mbedtls_platform_entropy_poll( void *data,
                           unsigned char *output, size_t len, size_t *olen )
{
    FILE *file;
    size_t read_len;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    ((void) data);

#if defined(HAVE_GETRANDOM)
    ret = getrandom_wrapper( output, len, 0 );
    if( ret >= 0 )
    {
        *olen = ret;
        return( 0 );
    }
    else if( errno != ENOSYS )
        return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );
    /* Fall through if the system call isn't known. */
#else
    ((void) ret);
#endif /* HAVE_GETRANDOM */

    *olen = 0;

    file = fopen( "/dev/urandom", "rb" );
    if( file == NULL )
        return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );

    read_len = fread( output, 1, len, file );
    if( read_len != len )
    {
        fclose( file );
        return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );
    }

    fclose( file );
    *olen = len;

    return( 0 );
}